

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

LoopContinueLayerParams * __thiscall
CoreML::Specification::LoopContinueLayerParams::New(LoopContinueLayerParams *this,Arena *arena)

{
  LoopContinueLayerParams *this_00;
  
  this_00 = (LoopContinueLayerParams *)operator_new(0x18);
  LoopContinueLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LoopContinueLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LoopContinueLayerParams* LoopContinueLayerParams::New(::google::protobuf::Arena* arena) const {
  LoopContinueLayerParams* n = new LoopContinueLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}